

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ClearLabelCase::iterate(ClearLabelCase *this)

{
  TestLog *pTVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined8 *puVar6;
  long *plVar7;
  size_t sVar8;
  NotSupportedError *this_00;
  size_type *psVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  long lVar11;
  undefined8 uVar12;
  ulong uVar13;
  undefined1 auVar14 [8];
  int outlen;
  ScopedLogSection section;
  ResultCollector result;
  char buffer [64];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2f8;
  undefined8 local_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  string local_2d8;
  ulong *local_2b8;
  long local_2b0;
  ulong local_2a8 [2];
  string local_298;
  int local_274;
  code *local_270;
  int local_268;
  undefined4 local_25c;
  ScopedLogSection local_258;
  undefined8 local_250;
  undefined1 local_248 [8];
  _func_int **local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238 [6];
  ios_base local_1d8 [8];
  ios_base local_1d0 [264];
  ResultCollector local_c8;
  char local_78 [72];
  long lVar5;
  
  bVar3 = isKHRDebugSupported((this->super_TestCase).m_context);
  if (!bVar3) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"GL_KHR_debug is not supported","isKHRDebugSupported(m_context)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDebugTests.cpp"
               ,0x79e);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar4);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_248 = (undefined1  [8])local_238;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_248," // ERROR: ","");
  tcu::ResultCollector::ResultCollector(&local_c8,pTVar1,(string *)local_248);
  if (local_248 != (undefined1  [8])local_238) {
    operator_delete((void *)local_248,local_238[0]._M_allocated_capacity + 1);
  }
  local_274 = -1;
  local_250 = (**(code **)(lVar5 + 0x640))(0x9117,0);
  iVar4 = (**(code **)(lVar5 + 0x800))();
  if (iVar4 != 0) {
    local_2b8 = local_2a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"Got Error ","");
    local_270 = glu::getErrorName;
    local_268 = iVar4;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_298,&local_270);
    uVar13 = 0xf;
    if (local_2b8 != local_2a8) {
      uVar13 = local_2a8[0];
    }
    if (uVar13 < local_298._M_string_length + local_2b0) {
      uVar12 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        uVar12 = local_298.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar12 < local_298._M_string_length + local_2b0) goto LAB_013a7085;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_298,0,(char *)0x0,(ulong)local_2b8);
    }
    else {
LAB_013a7085:
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_2b8,(ulong)local_298._M_dataplus._M_p)
      ;
    }
    local_2f8 = &local_2e8;
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 == paVar10) {
      local_2e8._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_2e8._8_8_ = puVar6[3];
    }
    else {
      local_2e8._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_2f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar6;
    }
    local_2f0 = puVar6[1];
    *puVar6 = paVar10;
    puVar6[1] = 0;
    paVar10->_M_local_buf[0] = '\0';
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_2f8);
    psVar9 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_2d8.field_2._M_allocated_capacity = *psVar9;
      local_2d8.field_2._8_8_ = plVar7[3];
      local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
    }
    else {
      local_2d8.field_2._M_allocated_capacity = *psVar9;
      local_2d8._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_2d8._M_string_length = plVar7[1];
    *plVar7 = (long)psVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_2d8);
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 == paVar10) {
      local_238[0]._0_8_ = paVar10->_M_allocated_capacity;
      local_238[0]._8_8_ = plVar7[3];
      local_248 = (undefined1  [8])local_238;
    }
    else {
      local_238[0]._0_8_ = paVar10->_M_allocated_capacity;
      local_248 = (undefined1  [8])*plVar7;
    }
    local_240 = (_func_int **)plVar7[1];
    *plVar7 = (long)paVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    tcu::ResultCollector::fail(&local_c8,(string *)local_248);
    if (local_248 != (undefined1  [8])local_238) {
      operator_delete((void *)local_248,local_238[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    if (local_2f8 != &local_2e8) {
      operator_delete(local_2f8,local_2e8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    if (local_2b8 != local_2a8) {
      operator_delete(local_2b8,local_2a8[0] + 1);
    }
  }
  local_25c = (**(code **)(lVar5 + 0x3f0))(0x8b30);
  iVar4 = (**(code **)(lVar5 + 0x800))();
  if (iVar4 == 0) goto LAB_013a747e;
  local_2b8 = local_2a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"Got Error ","");
  local_270 = glu::getErrorName;
  local_268 = iVar4;
  tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_298,&local_270);
  uVar13 = 0xf;
  if (local_2b8 != local_2a8) {
    uVar13 = local_2a8[0];
  }
  if (uVar13 < local_298._M_string_length + local_2b0) {
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      uVar12 = local_298.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar12 < local_298._M_string_length + local_2b0) goto LAB_013a72d6;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_298,0,(char *)0x0,(ulong)local_2b8);
  }
  else {
LAB_013a72d6:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_2b8,(ulong)local_298._M_dataplus._M_p);
  }
  local_2f8 = &local_2e8;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 == paVar10) {
    local_2e8._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_2e8._8_8_ = puVar6[3];
  }
  else {
    local_2e8._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_2f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar6;
  }
  local_2f0 = puVar6[1];
  *puVar6 = paVar10;
  puVar6[1] = 0;
  paVar10->_M_local_buf[0] = '\0';
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_2f8);
  psVar9 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_2d8.field_2._M_allocated_capacity = *psVar9;
    local_2d8.field_2._8_8_ = plVar7[3];
    local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  }
  else {
    local_2d8.field_2._M_allocated_capacity = *psVar9;
    local_2d8._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_2d8._M_string_length = plVar7[1];
  *plVar7 = (long)psVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_2d8);
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 == paVar10) {
    local_238[0]._0_8_ = paVar10->_M_allocated_capacity;
    local_238[0]._8_8_ = plVar7[3];
    local_248 = (undefined1  [8])local_238;
  }
  else {
    local_238[0]._0_8_ = paVar10->_M_allocated_capacity;
    local_248 = (undefined1  [8])*plVar7;
  }
  local_240 = (_func_int **)plVar7[1];
  *plVar7 = (long)paVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  tcu::ResultCollector::fail(&local_c8,(string *)local_248);
  if (local_248 != (undefined1  [8])local_238) {
    operator_delete((void *)local_248,local_238[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  if (local_2f8 != &local_2e8) {
    operator_delete(local_2f8,local_2e8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  if (local_2b8 != local_2a8) {
    operator_delete(local_2b8,local_2a8[0] + 1);
  }
LAB_013a747e:
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_248 = (undefined1  [8])local_238;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"Shader","");
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"Shader object","");
  tcu::ScopedLogSection::ScopedLogSection(&local_258,pTVar1,(string *)local_248,&local_2d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  if (local_248 != (undefined1  [8])local_238) {
    operator_delete((void *)local_248,local_238[0]._M_allocated_capacity + 1);
  }
  lVar11 = 8;
  do {
    local_248 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_240);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_240,"Setting label to string: \"",0x1a);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_240,"This is a debug label",0x15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_240,"\"",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_248,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_240);
    std::ios_base::~ios_base(local_1d0);
    (**(code **)(lVar5 + 0xfc0))(0x82e1,local_25c,0xfffffffe,"This is a debug label");
    iVar4 = (**(code **)(lVar5 + 0x800))();
    if (iVar4 != 0) {
      local_2b8 = local_2a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"Got Error ","");
      local_270 = glu::getErrorName;
      local_268 = iVar4;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_298,&local_270);
      uVar13 = 0xf;
      if (local_2b8 != local_2a8) {
        uVar13 = local_2a8[0];
      }
      if (uVar13 < local_298._M_string_length + local_2b0) {
        uVar12 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          uVar12 = local_298.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar12 < local_298._M_string_length + local_2b0) goto LAB_013a7680;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_298,0,(char *)0x0,(ulong)local_2b8);
      }
      else {
LAB_013a7680:
        puVar6 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_2b8,(ulong)local_298._M_dataplus._M_p);
      }
      local_2f8 = &local_2e8;
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 == paVar10) {
        local_2e8._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_2e8._8_8_ = puVar6[3];
      }
      else {
        local_2e8._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_2f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar6;
      }
      local_2f0 = puVar6[1];
      *puVar6 = paVar10;
      puVar6[1] = 0;
      paVar10->_M_local_buf[0] = '\0';
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_2f8);
      local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
      psVar9 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_2d8.field_2._M_allocated_capacity = *psVar9;
        local_2d8.field_2._8_8_ = plVar7[3];
      }
      else {
        local_2d8.field_2._M_allocated_capacity = *psVar9;
        local_2d8._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_2d8._M_string_length = plVar7[1];
      *plVar7 = (long)psVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_2d8);
      local_248 = (undefined1  [8])local_238;
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 == paVar10) {
        local_238[0]._0_8_ = paVar10->_M_allocated_capacity;
        local_238[0]._8_8_ = plVar7[3];
      }
      else {
        local_238[0]._0_8_ = paVar10->_M_allocated_capacity;
        local_248 = (undefined1  [8])*plVar7;
      }
      local_240 = (_func_int **)plVar7[1];
      *plVar7 = (long)paVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      tcu::ResultCollector::fail(&local_c8,(string *)local_248);
      if (local_248 != (undefined1  [8])local_238) {
        operator_delete((void *)local_248,local_238[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
      }
      if (local_2f8 != &local_2e8) {
        operator_delete(local_2f8,local_2e8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
      if (local_2b8 != local_2a8) {
        operator_delete(local_2b8,local_2a8[0] + 1);
      }
    }
    local_248 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_240);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_240,"Clearing label ",0xf);
    pcVar2 = *(char **)(&UNK_02152a78 + lVar11);
    if (pcVar2 == (char *)0x0) {
      std::ios::clear((int)(ostringstream *)&local_240 + (int)local_240[-3]);
    }
    else {
      sVar8 = strlen(pcVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_240,pcVar2,sVar8);
    }
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_248,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_240);
    std::ios_base::~ios_base(local_1d0);
    (**(code **)(lVar5 + 0xfc0))
              (0x82e1,local_25c,
               *(undefined4 *)((long)&iterate::s_clearMethods[0].description + lVar11),0);
    iVar4 = (**(code **)(lVar5 + 0x800))();
    if (iVar4 != 0) {
      local_2b8 = local_2a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"Got Error ","");
      local_270 = glu::getErrorName;
      local_268 = iVar4;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_298,&local_270);
      uVar13 = 0xf;
      if (local_2b8 != local_2a8) {
        uVar13 = local_2a8[0];
      }
      if (uVar13 < local_298._M_string_length + local_2b0) {
        uVar12 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          uVar12 = local_298.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar12 < local_298._M_string_length + local_2b0) goto LAB_013a79a4;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_298,0,(char *)0x0,(ulong)local_2b8);
      }
      else {
LAB_013a79a4:
        puVar6 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_2b8,(ulong)local_298._M_dataplus._M_p);
      }
      local_2f8 = &local_2e8;
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 == paVar10) {
        local_2e8._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_2e8._8_8_ = puVar6[3];
      }
      else {
        local_2e8._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_2f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar6;
      }
      local_2f0 = puVar6[1];
      *puVar6 = paVar10;
      puVar6[1] = 0;
      paVar10->_M_local_buf[0] = '\0';
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_2f8);
      local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
      psVar9 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_2d8.field_2._M_allocated_capacity = *psVar9;
        local_2d8.field_2._8_8_ = plVar7[3];
      }
      else {
        local_2d8.field_2._M_allocated_capacity = *psVar9;
        local_2d8._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_2d8._M_string_length = plVar7[1];
      *plVar7 = (long)psVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_2d8);
      local_248 = (undefined1  [8])local_238;
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 == paVar10) {
        local_238[0]._0_8_ = paVar10->_M_allocated_capacity;
        local_238[0]._8_8_ = plVar7[3];
      }
      else {
        local_238[0]._0_8_ = paVar10->_M_allocated_capacity;
        local_248 = (undefined1  [8])*plVar7;
      }
      local_240 = (_func_int **)plVar7[1];
      *plVar7 = (long)paVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      tcu::ResultCollector::fail(&local_c8,(string *)local_248);
      if (local_248 != (undefined1  [8])local_238) {
        operator_delete((void *)local_248,local_238[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
      }
      if (local_2f8 != &local_2e8) {
        operator_delete(local_2f8,local_2e8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
      if (local_2b8 != local_2a8) {
        operator_delete(local_2b8,local_2a8[0] + 1);
      }
    }
    local_248 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_240);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_240,"Querying label",0xe);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_248,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_240);
    std::ios_base::~ios_base(local_1d0);
    local_78[0] = 'X';
    local_274 = -1;
    (**(code **)(lVar5 + 0x958))(0x82e1,local_25c,0x40,&local_274,local_78);
    iVar4 = (**(code **)(lVar5 + 0x800))();
    if (iVar4 != 0) {
      local_2b8 = local_2a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"Got Error ","");
      local_270 = glu::getErrorName;
      local_268 = iVar4;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_298,&local_270);
      uVar13 = 0xf;
      if (local_2b8 != local_2a8) {
        uVar13 = local_2a8[0];
      }
      if (uVar13 < local_298._M_string_length + local_2b0) {
        uVar12 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          uVar12 = local_298.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar12 < local_298._M_string_length + local_2b0) goto LAB_013a7ca9;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_298,0,(char *)0x0,(ulong)local_2b8);
      }
      else {
LAB_013a7ca9:
        puVar6 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_2b8,(ulong)local_298._M_dataplus._M_p);
      }
      local_2f8 = &local_2e8;
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 == paVar10) {
        local_2e8._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_2e8._8_8_ = puVar6[3];
      }
      else {
        local_2e8._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_2f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar6;
      }
      local_2f0 = puVar6[1];
      *puVar6 = paVar10;
      puVar6[1] = 0;
      paVar10->_M_local_buf[0] = '\0';
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_2f8);
      local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
      psVar9 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_2d8.field_2._M_allocated_capacity = *psVar9;
        local_2d8.field_2._8_8_ = plVar7[3];
      }
      else {
        local_2d8.field_2._M_allocated_capacity = *psVar9;
        local_2d8._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_2d8._M_string_length = plVar7[1];
      *plVar7 = (long)psVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d8);
      local_248 = (undefined1  [8])local_238;
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 == paVar10) {
        local_238[0]._0_8_ = paVar10->_M_allocated_capacity;
        local_238[0]._8_8_ = puVar6[3];
      }
      else {
        local_238[0]._0_8_ = paVar10->_M_allocated_capacity;
        local_248 = (undefined1  [8])*puVar6;
      }
      local_240 = (_func_int **)puVar6[1];
      *puVar6 = paVar10;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      tcu::ResultCollector::fail(&local_c8,(string *)local_248);
      if (local_248 != (undefined1  [8])local_238) {
        operator_delete((void *)local_248,local_238[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
      }
      if (local_2f8 != &local_2e8) {
        operator_delete(local_2f8,local_2e8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
      if (local_2b8 != local_2a8) {
        operator_delete(local_2b8,local_2a8[0] + 1);
      }
    }
    if (local_274 == 0) {
      if (local_78[0] == '\0') {
        local_248 = (undefined1  [8])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_240);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_240,"Got 0-sized null-terminated string.",0x23);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_248,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_240);
        std::ios_base::~ios_base(local_1d0);
      }
      else {
        local_248 = (undefined1  [8])local_238;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_248,"label was not null terminated","");
        tcu::ResultCollector::fail(&local_c8,(string *)local_248);
        uVar12 = local_238[0]._M_allocated_capacity;
        auVar14 = local_248;
        if (local_248 != (undefined1  [8])local_238) goto LAB_013a7fc3;
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_248);
      std::ostream::operator<<((MessageBuilder *)local_248,local_274);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_248);
      std::ios_base::~ios_base(local_1d8);
      plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_2f8,0,(char *)0x0,0x1c2cca8);
      local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
      psVar9 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_2d8.field_2._M_allocated_capacity = *psVar9;
        local_2d8.field_2._8_8_ = plVar7[3];
      }
      else {
        local_2d8.field_2._M_allocated_capacity = *psVar9;
        local_2d8._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_2d8._M_string_length = plVar7[1];
      *plVar7 = (long)psVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      tcu::ResultCollector::fail(&local_c8,&local_2d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
      }
      uVar12 = local_2e8._M_allocated_capacity;
      auVar14 = (undefined1  [8])local_2f8;
      if (local_2f8 != &local_2e8) {
LAB_013a7fc3:
        operator_delete((void *)auVar14,uVar12 + 1);
      }
    }
    lVar11 = lVar11 + 0x10;
  } while (lVar11 != 0x38);
  tcu::TestLog::endSection(local_258.m_log);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_248 = (undefined1  [8])local_238;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"Sync","");
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"Sync object","");
  tcu::ScopedLogSection::ScopedLogSection(&local_258,pTVar1,(string *)local_248,&local_2d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  if (local_248 != (undefined1  [8])local_238) {
    operator_delete((void *)local_248,local_238[0]._M_allocated_capacity + 1);
  }
  lVar11 = 8;
  do {
    local_248 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_240);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_240,"Setting label to string: \"",0x1a);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_240,"This is a debug label",0x15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_240,"\"",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_248,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_240);
    std::ios_base::~ios_base(local_1d0);
    (**(code **)(lVar5 + 0xfc8))(local_250,0xfffffffe,"This is a debug label");
    iVar4 = (**(code **)(lVar5 + 0x800))();
    if (iVar4 != 0) {
      local_2b8 = local_2a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"Got Error ","");
      local_270 = glu::getErrorName;
      local_268 = iVar4;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_298,&local_270);
      uVar13 = 0xf;
      if (local_2b8 != local_2a8) {
        uVar13 = local_2a8[0];
      }
      if (uVar13 < local_298._M_string_length + local_2b0) {
        uVar12 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          uVar12 = local_298.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar12 < local_298._M_string_length + local_2b0) goto LAB_013a824e;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_298,0,(char *)0x0,(ulong)local_2b8);
      }
      else {
LAB_013a824e:
        puVar6 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_2b8,(ulong)local_298._M_dataplus._M_p);
      }
      local_2f8 = &local_2e8;
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 == paVar10) {
        local_2e8._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_2e8._8_8_ = puVar6[3];
      }
      else {
        local_2e8._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_2f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar6;
      }
      local_2f0 = puVar6[1];
      *puVar6 = paVar10;
      puVar6[1] = 0;
      paVar10->_M_local_buf[0] = '\0';
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_2f8);
      local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
      psVar9 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_2d8.field_2._M_allocated_capacity = *psVar9;
        local_2d8.field_2._8_8_ = plVar7[3];
      }
      else {
        local_2d8.field_2._M_allocated_capacity = *psVar9;
        local_2d8._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_2d8._M_string_length = plVar7[1];
      *plVar7 = (long)psVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_2d8);
      local_248 = (undefined1  [8])local_238;
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 == paVar10) {
        local_238[0]._0_8_ = paVar10->_M_allocated_capacity;
        local_238[0]._8_8_ = plVar7[3];
      }
      else {
        local_238[0]._0_8_ = paVar10->_M_allocated_capacity;
        local_248 = (undefined1  [8])*plVar7;
      }
      local_240 = (_func_int **)plVar7[1];
      *plVar7 = (long)paVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      tcu::ResultCollector::fail(&local_c8,(string *)local_248);
      if (local_248 != (undefined1  [8])local_238) {
        operator_delete((void *)local_248,local_238[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
      }
      if (local_2f8 != &local_2e8) {
        operator_delete(local_2f8,local_2e8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
      if (local_2b8 != local_2a8) {
        operator_delete(local_2b8,local_2a8[0] + 1);
      }
    }
    local_248 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_240);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_240,"Clearing label ",0xf);
    pcVar2 = *(char **)(&UNK_02152a78 + lVar11);
    if (pcVar2 == (char *)0x0) {
      std::ios::clear((int)(ostringstream *)&local_240 + (int)local_240[-3]);
    }
    else {
      sVar8 = strlen(pcVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_240,pcVar2,sVar8);
    }
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_248,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_240);
    std::ios_base::~ios_base(local_1d0);
    (**(code **)(lVar5 + 0xfc8))
              (local_250,*(undefined4 *)((long)&iterate::s_clearMethods[0].description + lVar11),0);
    iVar4 = (**(code **)(lVar5 + 0x800))();
    if (iVar4 != 0) {
      local_2b8 = local_2a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"Got Error ","");
      local_270 = glu::getErrorName;
      local_268 = iVar4;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_298,&local_270);
      uVar13 = 0xf;
      if (local_2b8 != local_2a8) {
        uVar13 = local_2a8[0];
      }
      if (uVar13 < local_298._M_string_length + local_2b0) {
        uVar12 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          uVar12 = local_298.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar12 < local_298._M_string_length + local_2b0) goto LAB_013a856e;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_298,0,(char *)0x0,(ulong)local_2b8);
      }
      else {
LAB_013a856e:
        puVar6 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_2b8,(ulong)local_298._M_dataplus._M_p);
      }
      local_2f8 = &local_2e8;
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 == paVar10) {
        local_2e8._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_2e8._8_8_ = puVar6[3];
      }
      else {
        local_2e8._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_2f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar6;
      }
      local_2f0 = puVar6[1];
      *puVar6 = paVar10;
      puVar6[1] = 0;
      paVar10->_M_local_buf[0] = '\0';
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_2f8);
      local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
      psVar9 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_2d8.field_2._M_allocated_capacity = *psVar9;
        local_2d8.field_2._8_8_ = plVar7[3];
      }
      else {
        local_2d8.field_2._M_allocated_capacity = *psVar9;
        local_2d8._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_2d8._M_string_length = plVar7[1];
      *plVar7 = (long)psVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_2d8);
      local_248 = (undefined1  [8])local_238;
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 == paVar10) {
        local_238[0]._0_8_ = paVar10->_M_allocated_capacity;
        local_238[0]._8_8_ = plVar7[3];
      }
      else {
        local_238[0]._0_8_ = paVar10->_M_allocated_capacity;
        local_248 = (undefined1  [8])*plVar7;
      }
      local_240 = (_func_int **)plVar7[1];
      *plVar7 = (long)paVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      tcu::ResultCollector::fail(&local_c8,(string *)local_248);
      if (local_248 != (undefined1  [8])local_238) {
        operator_delete((void *)local_248,local_238[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
      }
      if (local_2f8 != &local_2e8) {
        operator_delete(local_2f8,local_2e8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
      if (local_2b8 != local_2a8) {
        operator_delete(local_2b8,local_2a8[0] + 1);
      }
    }
    local_248 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_240);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_240,"Querying label",0xe);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_248,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_240);
    std::ios_base::~ios_base(local_1d0);
    local_78[0] = 'X';
    local_274 = -1;
    (**(code **)(lVar5 + 0x960))(local_250,0x40,&local_274,local_78);
    iVar4 = (**(code **)(lVar5 + 0x800))();
    if (iVar4 != 0) {
      local_2b8 = local_2a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"Got Error ","");
      local_270 = glu::getErrorName;
      local_268 = iVar4;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_298,&local_270);
      uVar13 = 0xf;
      if (local_2b8 != local_2a8) {
        uVar13 = local_2a8[0];
      }
      if (uVar13 < local_298._M_string_length + local_2b0) {
        uVar12 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          uVar12 = local_298.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar12 < local_298._M_string_length + local_2b0) goto LAB_013a886f;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_298,0,(char *)0x0,(ulong)local_2b8);
      }
      else {
LAB_013a886f:
        puVar6 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_2b8,(ulong)local_298._M_dataplus._M_p);
      }
      local_2f8 = &local_2e8;
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 == paVar10) {
        local_2e8._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_2e8._8_8_ = puVar6[3];
      }
      else {
        local_2e8._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_2f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar6;
      }
      local_2f0 = puVar6[1];
      *puVar6 = paVar10;
      puVar6[1] = 0;
      paVar10->_M_local_buf[0] = '\0';
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_2f8);
      local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
      psVar9 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_2d8.field_2._M_allocated_capacity = *psVar9;
        local_2d8.field_2._8_8_ = plVar7[3];
      }
      else {
        local_2d8.field_2._M_allocated_capacity = *psVar9;
        local_2d8._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_2d8._M_string_length = plVar7[1];
      *plVar7 = (long)psVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d8);
      local_248 = (undefined1  [8])local_238;
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 == paVar10) {
        local_238[0]._0_8_ = paVar10->_M_allocated_capacity;
        local_238[0]._8_8_ = puVar6[3];
      }
      else {
        local_238[0]._0_8_ = paVar10->_M_allocated_capacity;
        local_248 = (undefined1  [8])*puVar6;
      }
      local_240 = (_func_int **)puVar6[1];
      *puVar6 = paVar10;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      tcu::ResultCollector::fail(&local_c8,(string *)local_248);
      if (local_248 != (undefined1  [8])local_238) {
        operator_delete((void *)local_248,local_238[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
      }
      if (local_2f8 != &local_2e8) {
        operator_delete(local_2f8,local_2e8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
      if (local_2b8 != local_2a8) {
        operator_delete(local_2b8,local_2a8[0] + 1);
      }
    }
    if (local_274 == 0) {
      if (local_78[0] == '\0') {
        local_248 = (undefined1  [8])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_240);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_240,"Got 0-sized null-terminated string.",0x23);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_248,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_240);
        std::ios_base::~ios_base(local_1d0);
      }
      else {
        local_248 = (undefined1  [8])local_238;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_248,"label was not null terminated","");
        tcu::ResultCollector::fail(&local_c8,(string *)local_248);
        uVar12 = local_238[0]._M_allocated_capacity;
        auVar14 = local_248;
        if (local_248 != (undefined1  [8])local_238) goto LAB_013a8b89;
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_248);
      std::ostream::operator<<((MessageBuilder *)local_248,local_274);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_248);
      std::ios_base::~ios_base(local_1d8);
      plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_2f8,0,(char *)0x0,0x1c2cca8);
      local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
      psVar9 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_2d8.field_2._M_allocated_capacity = *psVar9;
        local_2d8.field_2._8_8_ = plVar7[3];
      }
      else {
        local_2d8.field_2._M_allocated_capacity = *psVar9;
        local_2d8._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_2d8._M_string_length = plVar7[1];
      *plVar7 = (long)psVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      tcu::ResultCollector::fail(&local_c8,&local_2d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
      }
      uVar12 = local_2e8._M_allocated_capacity;
      auVar14 = (undefined1  [8])local_2f8;
      if (local_2f8 != &local_2e8) {
LAB_013a8b89:
        operator_delete((void *)auVar14,uVar12 + 1);
      }
    }
    lVar11 = lVar11 + 0x10;
    if (lVar11 == 0x38) {
      tcu::TestLog::endSection(local_258.m_log);
      (**(code **)(lVar5 + 0x470))(local_25c);
      (**(code **)(lVar5 + 0x478))(local_250);
      tcu::ResultCollector::setTestContextResult
                (&local_c8,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.m_message._M_dataplus._M_p != &local_c8.m_message.field_2) {
        operator_delete(local_c8.m_message._M_dataplus._M_p,
                        local_c8.m_message.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.m_prefix._M_dataplus._M_p != &local_c8.m_prefix.field_2) {
        operator_delete(local_c8.m_prefix._M_dataplus._M_p,
                        local_c8.m_prefix.field_2._M_allocated_capacity + 1);
      }
      return STOP;
    }
  } while( true );
}

Assistant:

ClearLabelCase::IterateResult ClearLabelCase::iterate (void)
{
	TCU_CHECK_AND_THROW(NotSupportedError, isKHRDebugSupported(m_context), "GL_KHR_debug is not supported");

	static const struct
	{
		const char*	description;
		int			length;
	} s_clearMethods[] =
	{
		{ " with NULL label and 0 length",			0	},
		{ " with NULL label and 1 length",			1	},
		{ " with NULL label and negative length",	-1	},
	};

	const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
	tcu::ResultCollector	result		(m_testCtx.getLog(), " // ERROR: ");
	const char*	const		msg			= "This is a debug label";
	int						outlen		= -1;
	GLuint					shader;
	glw::GLsync				sync;
	char					buffer[64];

	sync = gl.fenceSync(GL_SYNC_GPU_COMMANDS_COMPLETE, 0);
	GLS_COLLECT_GL_ERROR(result, gl.getError(), "fenceSync");

	shader = gl.createShader(GL_FRAGMENT_SHADER);
	GLS_COLLECT_GL_ERROR(result, gl.getError(), "createShader");

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Shader", "Shader object");

		for (int methodNdx = 0; methodNdx < DE_LENGTH_OF_ARRAY(s_clearMethods); ++methodNdx)
		{
			m_testCtx.getLog() << TestLog::Message << "Setting label to string: \"" << msg << "\"" << TestLog::EndMessage;
			gl.objectLabel(GL_SHADER, shader, -2,  msg);
			GLS_COLLECT_GL_ERROR(result, gl.getError(), "objectLabel");

			m_testCtx.getLog() << TestLog::Message << "Clearing label " << s_clearMethods[methodNdx].description << TestLog::EndMessage;
			gl.objectLabel(GL_SHADER, shader, s_clearMethods[methodNdx].length, DE_NULL);
			GLS_COLLECT_GL_ERROR(result, gl.getError(), "objectLabel");

			m_testCtx.getLog() << TestLog::Message << "Querying label" << TestLog::EndMessage;
			buffer[0] = 'X';
			outlen = -1;
			gl.getObjectLabel(GL_SHADER, shader, sizeof(buffer), &outlen, buffer);
			GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectLabel");

			if (outlen != 0)
				result.fail("'length' was not zero, got " + de::toString(outlen));
			else if (buffer[0] != '\0')
				result.fail("label was not null terminated");
			else
				m_testCtx.getLog() << TestLog::Message << "Got 0-sized null-terminated string." << TestLog::EndMessage;
		}
	}

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Sync", "Sync object");

		for (int methodNdx = 0; methodNdx < DE_LENGTH_OF_ARRAY(s_clearMethods); ++methodNdx)
		{
			m_testCtx.getLog() << TestLog::Message << "Setting label to string: \"" << msg << "\"" << TestLog::EndMessage;
			gl.objectPtrLabel(sync, -2, msg);
			GLS_COLLECT_GL_ERROR(result, gl.getError(), "objectPtrLabel");

			m_testCtx.getLog() << TestLog::Message << "Clearing label " << s_clearMethods[methodNdx].description << TestLog::EndMessage;
			gl.objectPtrLabel(sync, s_clearMethods[methodNdx].length, DE_NULL);
			GLS_COLLECT_GL_ERROR(result, gl.getError(), "objectPtrLabel");

			m_testCtx.getLog() << TestLog::Message << "Querying label" << TestLog::EndMessage;
			buffer[0] = 'X';
			outlen = -1;
			gl.getObjectPtrLabel(sync, sizeof(buffer), &outlen, buffer);
			GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectPtrLabel");

			if (outlen != 0)
				result.fail("'length' was not zero, got " + de::toString(outlen));
			else if (buffer[0] != '\0')
				result.fail("label was not null terminated");
			else
				m_testCtx.getLog() << TestLog::Message << "Got 0-sized null-terminated string." << TestLog::EndMessage;
		}
	}

	gl.deleteShader(shader);
	gl.deleteSync(sync);

	result.setTestContextResult(m_testCtx);
	return STOP;
}